

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mysqlhs_index.cpp
# Opt level: O1

bool __thiscall
mysqlhs::index::insert
          (index *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *params)

{
  pointer pbVar1;
  bool bVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *p;
  pointer pbVar3;
  ostringstream *poVar4;
  
  connection::clear(this->conn_);
  poVar4 = &this->conn_->oss;
  std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,"\t+\t",3);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  pbVar1 = (params->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar3 = (params->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start; pbVar3 != pbVar1; pbVar3 = pbVar3 + 1) {
    poVar4 = &this->conn_->oss;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,"\t",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar4,(pbVar3->_M_dataplus)._M_p,pbVar3->_M_string_length);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&this->conn_->oss,"\n",1);
  bVar2 = connection::query(this->conn_,insert_);
  if (bVar2) {
    bVar2 = connection::is_okay(this->conn_);
    return bVar2;
  }
  return false;
}

Assistant:

bool index::insert(const std::vector<std::string>& params)
	{
		conn_.clear();
		conn_ << index_id_ << "\t+\t" << params.size();

		for (auto& p : params)
		{
			conn_ << "\t" << p;
		}
		conn_ << "\n";

		if (!conn_.query(query_type::insert_) || !conn_.is_okay())
		{
			return false;
		}

		return true;
	}